

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

string * __thiscall
phosg::StringReader::get_line_abi_cxx11_
          (string *__return_storage_ptr__,StringReader *this,bool advance)

{
  size_t sVar1;
  bool bVar2;
  out_of_range *this_00;
  size_type sVar3;
  allocator<char> local_61;
  string local_60;
  int8_t local_39;
  ulong uStack_38;
  uint8_t ch;
  size_t ch_offset;
  byte local_19;
  StringReader *pSStack_18;
  bool advance_local;
  StringReader *this_local;
  string *ret;
  
  local_19 = advance;
  pSStack_18 = this;
  this_local = (StringReader *)__return_storage_ptr__;
  bVar2 = eof(this);
  if (!bVar2) {
    ch_offset._3_1_ = 0;
    ::std::__cxx11::string::string((string *)__return_storage_ptr__);
    while( true ) {
      sVar1 = this->offset;
      sVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size(__return_storage_ptr__);
      uStack_38 = sVar1 + sVar3;
      if ((this->length <= uStack_38) || (local_39 = pget_s8(this,uStack_38), local_39 == '\n'))
      break;
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,local_39);
    }
    if ((local_19 & 1) != 0) {
      sVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size(__return_storage_ptr__);
      this->offset = sVar3 + 1 + this->offset;
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"\r",&local_61);
    bVar2 = ends_with(__return_storage_ptr__,&local_60);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::allocator<char>::~allocator(&local_61);
    if (bVar2) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (__return_storage_ptr__);
    }
    return __return_storage_ptr__;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  ::std::out_of_range::out_of_range(this_00,"end of string");
  __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
}

Assistant:

string StringReader::get_line(bool advance) {
  if (this->eof()) {
    throw out_of_range("end of string");
  }

  string ret;
  for (;;) {
    size_t ch_offset = this->offset + ret.size();
    if (ch_offset >= this->length) {
      break;
    }
    uint8_t ch = this->pget_s8(ch_offset);
    if (ch != '\n') {
      ret += ch;
    } else {
      break;
    }
  }
  if (advance) {
    this->offset += (ret.size() + 1);
  }
  if (ends_with(ret, "\r")) {
    ret.pop_back();
  }
  return ret;
}